

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-param-util.h
# Opt level: O3

ParamGenerator<libaom_test::FuncParam<void_(*)(short_*,_const_short_*,_const_short_*,_int)>_>
__thiscall testing::internal::ValueArray::operator_cast_to_ParamGenerator(ValueArray *this)

{
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  undefined8 *in_RSI;
  ParamGenerator<libaom_test::FuncParam<void_(*)(short_*,_const_short_*,_const_short_*,_int)>_>
  PVar2;
  initializer_list<libaom_test::FuncParam<void_(*)(short_*,_const_short_*,_const_short_*,_int)>_>
  __l;
  allocator_type local_41;
  vector<libaom_test::FuncParam<void_(*)(short_*,_const_short_*,_const_short_*,_int)>,_std::allocator<libaom_test::FuncParam<void_(*)(short_*,_const_short_*,_const_short_*,_int)>_>_>
  local_40;
  FuncParam<void_(*)(short_*,_const_short_*,_const_short_*,_int)> local_28;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var1;
  
  local_28.bit_depth = *(int *)(in_RSI + 2);
  local_28.ref_func = (_func_void_short_ptr_short_ptr_short_ptr_int *)*in_RSI;
  local_28.tst_func = (_func_void_short_ptr_short_ptr_short_ptr_int *)in_RSI[1];
  __l._M_len = 1;
  __l._M_array = &local_28;
  std::
  vector<libaom_test::FuncParam<void_(*)(short_*,_const_short_*,_const_short_*,_int)>,_std::allocator<libaom_test::FuncParam<void_(*)(short_*,_const_short_*,_const_short_*,_int)>_>_>
  ::vector(&local_40,__l,&local_41);
  PVar2 = ValuesIn<__gnu_cxx::__normal_iterator<libaom_test::FuncParam<void(*)(short*,short_const*,short_const*,int)>const*,std::vector<libaom_test::FuncParam<void(*)(short*,short_const*,short_const*,int)>,std::allocator<libaom_test::FuncParam<void(*)(short*,short_const*,short_const*,int)>>>>>
                    ((testing *)this,
                     (__normal_iterator<const_libaom_test::FuncParam<void_(*)(short_*,_const_short_*,_const_short_*,_int)>_*,_std::vector<libaom_test::FuncParam<void_(*)(short_*,_const_short_*,_const_short_*,_int)>,_std::allocator<libaom_test::FuncParam<void_(*)(short_*,_const_short_*,_const_short_*,_int)>_>_>_>
                      )local_40.
                       super__Vector_base<libaom_test::FuncParam<void_(*)(short_*,_const_short_*,_const_short_*,_int)>,_std::allocator<libaom_test::FuncParam<void_(*)(short_*,_const_short_*,_const_short_*,_int)>_>_>
                       ._M_impl.super__Vector_impl_data._M_start,
                     (__normal_iterator<const_libaom_test::FuncParam<void_(*)(short_*,_const_short_*,_const_short_*,_int)>_*,_std::vector<libaom_test::FuncParam<void_(*)(short_*,_const_short_*,_const_short_*,_int)>,_std::allocator<libaom_test::FuncParam<void_(*)(short_*,_const_short_*,_const_short_*,_int)>_>_>_>
                      )local_40.
                       super__Vector_base<libaom_test::FuncParam<void_(*)(short_*,_const_short_*,_const_short_*,_int)>,_std::allocator<libaom_test::FuncParam<void_(*)(short_*,_const_short_*,_const_short_*,_int)>_>_>
                       ._M_impl.super__Vector_impl_data._M_finish);
  _Var1._M_pi = PVar2.impl_.
                super___shared_ptr<const_testing::internal::ParamGeneratorInterface<libaom_test::FuncParam<void_(*)(short_*,_const_short_*,_const_short_*,_int)>_>,_(__gnu_cxx::_Lock_policy)2>
                ._M_refcount._M_pi;
  if (local_40.
      super__Vector_base<libaom_test::FuncParam<void_(*)(short_*,_const_short_*,_const_short_*,_int)>,_std::allocator<libaom_test::FuncParam<void_(*)(short_*,_const_short_*,_const_short_*,_int)>_>_>
      ._M_impl.super__Vector_impl_data._M_start !=
      (FuncParam<void_(*)(short_*,_const_short_*,_const_short_*,_int)> *)0x0) {
    operator_delete(local_40.
                    super__Vector_base<libaom_test::FuncParam<void_(*)(short_*,_const_short_*,_const_short_*,_int)>,_std::allocator<libaom_test::FuncParam<void_(*)(short_*,_const_short_*,_const_short_*,_int)>_>_>
                    ._M_impl.super__Vector_impl_data._M_start);
    _Var1._M_pi = extraout_RDX;
  }
  PVar2.impl_.
  super___shared_ptr<const_testing::internal::ParamGeneratorInterface<libaom_test::FuncParam<void_(*)(short_*,_const_short_*,_const_short_*,_int)>_>,_(__gnu_cxx::_Lock_policy)2>
  ._M_refcount._M_pi = _Var1._M_pi;
  PVar2.impl_.
  super___shared_ptr<const_testing::internal::ParamGeneratorInterface<libaom_test::FuncParam<void_(*)(short_*,_const_short_*,_const_short_*,_int)>_>,_(__gnu_cxx::_Lock_policy)2>
  ._M_ptr = (element_type *)this;
  return (ParamGenerator<libaom_test::FuncParam<void_(*)(short_*,_const_short_*,_const_short_*,_int)>_>
          )PVar2.impl_.
           super___shared_ptr<const_testing::internal::ParamGeneratorInterface<libaom_test::FuncParam<void_(*)(short_*,_const_short_*,_const_short_*,_int)>_>,_(__gnu_cxx::_Lock_policy)2>
  ;
}

Assistant:

operator ParamGenerator<T>() const {  // NOLINT
    return ValuesIn(MakeVector<T>(MakeIndexSequence<sizeof...(Ts)>()));
  }